

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

bool chaiscript::detail::Dispatch_Engine::function_less_than
               (Proxy_Function *lhs,Proxy_Function *rhs)

{
  Type_Info *this;
  Type_Info *ti;
  element_type *peVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  pointer pTVar5;
  pointer pTVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong uVar11;
  byte bVar12;
  Type_Info boxed_pod_type;
  Type_Info boxed_type;
  uint local_84;
  Type_Info local_60;
  Type_Info local_48;
  
  peVar1 = (lhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = __dynamic_cast(peVar1,&dispatch::Proxy_Function_Base::typeinfo,
                           &dispatch::Dynamic_Proxy_Function::typeinfo,0);
  }
  if (lVar8 == 0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar8 = 0;
  }
  else {
    this_01 = (lhs->
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
  }
  peVar1 = (rhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = __dynamic_cast(peVar1,&dispatch::Proxy_Function_Base::typeinfo,
                           &dispatch::Dynamic_Proxy_Function::typeinfo,0);
  }
  if (lVar9 == 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar9 = 0;
  }
  else {
    this_00 = (rhs->
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  if (lVar9 == 0 || lVar8 == 0) {
    if (lVar8 == 0 || lVar9 != 0) {
      bVar12 = 1;
      if (lVar8 != 0 || lVar9 == 0) {
        peVar1 = (lhs->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        peVar4 = (rhs->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        uVar10 = ((long)(peVar1->m_types).
                        super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar1->m_types).
                        super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        uVar11 = ((long)(peVar4->m_types).
                        super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar4->m_types).
                        super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        local_48.m_type_info = (type_info *)&Boxed_Value::typeinfo;
        local_48.m_bare_type_info = (type_info *)&Boxed_Value::typeinfo;
        bVar12 = 0;
        local_48.m_flags = 0;
        local_60.m_type_info = (type_info *)&Boxed_Number::typeinfo;
        local_60.m_bare_type_info = (type_info *)&Boxed_Number::typeinfo;
        local_60.m_flags = 0;
        if (uVar10 < uVar11) {
          uVar11 = uVar10;
        }
        if (1 < uVar11) {
          lVar9 = uVar11 - 1;
          lVar8 = 0x18;
          local_84 = (uint)uVar10;
          do {
            pTVar5 = (peVar1->m_types).
                     super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            this = (Type_Info *)((long)&pTVar5->m_type_info + lVar8);
            pTVar6 = (peVar4->m_types).
                     super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ti = (Type_Info *)((long)&pTVar6->m_type_info + lVar8);
            bVar7 = Type_Info::bare_equal(this,ti);
            if ((!bVar7) ||
               (bVar7 = true,
               (*(byte *)((long)&pTVar5->m_flags + lVar8) & 1) !=
               (*(byte *)((long)&pTVar6->m_flags + lVar8) & 1))) {
              bVar7 = Type_Info::bare_equal(this,ti);
              if ((bVar7) &&
                 (((*(byte *)((long)&pTVar5->m_flags + lVar8) & 1) != 0 &&
                  ((*(byte *)((long)&pTVar6->m_flags + lVar8) & 1) == 0)))) {
LAB_002d09eb:
                bVar7 = false;
                local_84 = 0;
              }
              else {
                bVar7 = Type_Info::bare_equal(this,ti);
                if ((bVar7) && ((*(byte *)((long)&pTVar5->m_flags + lVar8) & 1) == 0)) {
LAB_002d0a06:
                  local_84 = 1;
                }
                else {
                  bVar7 = Type_Info::bare_equal(this,&local_48);
                  if (bVar7) goto LAB_002d09eb;
                  bVar7 = Type_Info::bare_equal(ti,&local_48);
                  if (bVar7) goto LAB_002d0a06;
                  bVar7 = Type_Info::bare_equal(this,&local_60);
                  if (bVar7) goto LAB_002d09eb;
                  bVar7 = Type_Info::bare_equal(ti,&local_60);
                  if (bVar7) goto LAB_002d0a06;
                  bVar7 = std::type_info::before(this->m_type_info,ti->m_type_info);
                  local_84 = (uint)bVar7;
                }
                bVar7 = false;
              }
            }
            if (!bVar7) {
              bVar12 = (byte)local_84;
              goto LAB_002d0aaa;
            }
            lVar8 = lVar8 + 0x18;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          bVar12 = 0;
        }
      }
    }
    else {
      bVar12 = 0;
    }
  }
  else {
    lVar2 = *(long *)(lVar8 + 0x48);
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 0x50);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (lVar2 == 0) {
      bVar12 = 0;
    }
    else {
      lVar8 = *(long *)(lVar9 + 0x48);
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x50);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      bVar12 = lVar8 == 0;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
    }
  }
LAB_002d0aaa:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return (bool)(bVar12 & 1);
}

Assistant:

static bool function_less_than(const Proxy_Function &lhs, const Proxy_Function &rhs) noexcept {
        auto dynamic_lhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(lhs));
        auto dynamic_rhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(rhs));

        if (dynamic_lhs && dynamic_rhs) {
          if (dynamic_lhs->get_guard()) {
            return dynamic_rhs->get_guard() ? false : true;
          } else {
            return false;
          }
        }

        if (dynamic_lhs && !dynamic_rhs) {
          return false;
        }

        if (!dynamic_lhs && dynamic_rhs) {
          return true;
        }

        const auto &lhsparamtypes = lhs->get_param_types();
        const auto &rhsparamtypes = rhs->get_param_types();

        const auto lhssize = lhsparamtypes.size();
        const auto rhssize = rhsparamtypes.size();

        const auto boxed_type = user_type<Boxed_Value>();
        const auto boxed_pod_type = user_type<Boxed_Number>();

        for (size_t i = 1; i < lhssize && i < rhssize; ++i) {
          const Type_Info &lt = lhsparamtypes[i];
          const Type_Info &rt = rhsparamtypes[i];

          if (lt.bare_equal(rt) && lt.is_const() == rt.is_const()) {
            continue; // The first two types are essentially the same, next iteration
          }

          // const is after non-const for the same type
          if (lt.bare_equal(rt) && lt.is_const() && !rt.is_const()) {
            return false;
          }

          if (lt.bare_equal(rt) && !lt.is_const()) {
            return true;
          }

          // boxed_values are sorted last
          if (lt.bare_equal(boxed_type)) {
            return false;
          }

          if (rt.bare_equal(boxed_type)) {
            return true;
          }

          if (lt.bare_equal(boxed_pod_type)) {
            return false;
          }

          if (rt.bare_equal(boxed_pod_type)) {
            return true;
          }

          // otherwise, we want to sort by typeid
          return lt < rt;
        }

        return false;
      }